

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignumlib.cpp
# Opt level: O2

void __thiscall CVmObjBigNum::wp8s(CVmObjBigNum *this,char *buf,int *ov)

{
  byte bVar1;
  uint uVar2;
  
  bVar1 = (this->super_CVmObject).ext_[4];
  wp8abs(this,buf,ov);
  if ((bVar1 & 1) == 0) {
    uVar2 = (byte)buf[7] & 0xffffff80;
  }
  else {
    twos_complement_p8((uchar *)buf);
    uVar2 = (uint)(-1 < buf[7]);
  }
  *ov = *ov | uVar2;
  return;
}

Assistant:

void CVmObjBigNum::wp8s(char *buf, int &ov) const
{
    /* note if the value is negative */
    int neg = get_neg(ext_);

    /* generate the absolute value */
    wp8abs(buf, ov);

    /* if it's negative, compute the 2's complement of the buffer */
    if (neg)
    {
        /* take the 2's complement */
        twos_complement_p8((unsigned char *)buf);

        /* if it didn't come out negative, we have an overflow */
        ov |= ((buf[7] & 0x80) == 0);
    }
    else
    {
        /* positive - the sign bit is set, we overflowed */
        ov |= (buf[7] & 0x80);
    }
}